

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.cpp
# Opt level: O2

void mjs::run_test_spec(string_view *source_text,string_view *name)

{
  version vVar1;
  size_type __pos;
  size_type sVar2;
  size_t __val;
  runtime_error *prVar3;
  wostream *pwVar4;
  size_type __pos_00;
  ulong __pos_01;
  allocator<char> local_359;
  string local_358;
  vector<mjs::test_spec,_std::allocator<mjs::test_spec>_> specs;
  block_statement *local_318;
  source_extend extend;
  char delim [4];
  shared_ptr<mjs::source_file> file;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_2d8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  gc_heap heap;
  string local_208;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  wostringstream oss;
  wchar_t local_198 [4];
  value local_188 [8];
  
  builtin_strncpy(delim,"//$",4);
  gc_heap::gc_heap(&heap,0x100000);
  specs.super__Vector_base<mjs::test_spec,_std::allocator<mjs::test_spec>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  specs.super__Vector_base<mjs::test_spec,_std::allocator<mjs::test_spec>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  specs.super__Vector_base<mjs::test_spec,_std::allocator<mjs::test_spec>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _oss = local_198;
  std::__cxx11::wstring::_M_construct<char_const*>
            ((wstring *)&oss,name->_M_str,name->_M_str + name->_M_len);
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::wstring::_M_construct<char_const*>
            ((wstring *)&local_358,source_text->_M_str,source_text->_M_str + source_text->_M_len);
  vVar1 = tested_version();
  extend.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(extend.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                _4_4_,vVar1);
  std::make_shared<mjs::source_file,std::__cxx11::wstring,std::__cxx11::wstring,mjs::version>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&file,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&oss,
             (version *)&local_358);
  std::__cxx11::wstring::~wstring((wstring *)&local_358);
  std::__cxx11::wstring::~wstring((wstring *)&oss);
  __pos_01 = 0;
  while (__pos_01 < source_text->_M_len) {
    __pos = std::basic_string_view<char,_std::char_traits<char>_>::find(source_text,delim,__pos_01);
    if (__pos == 0xffffffffffffffff) break;
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find(source_text,"\n",__pos);
    if (sVar2 == 0xffffffffffffffff) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&extend,name,(allocator<char> *)local_2d8);
      std::operator+(&local_358,"Invalid test spec.",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&extend);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                     &local_358,": line terminator missing.");
      std::runtime_error::runtime_error(prVar3,(string *)&oss);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    __pos_00 = __pos + 3;
    std::__shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2> *)&extend,
               &file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>);
    extend.start = (uint32_t)__pos_01;
    extend.end = (uint32_t)sVar2;
    source_extend::source_extend((source_extend *)&oss,&extend);
    local_198[2] = (wchar_t)__pos_00;
    local_2b8._0_16_ =
         std::basic_string_view<char,_std::char_traits<char>_>::substr
                   (source_text,__pos_00,sVar2 - __pos_00);
    local_2d8[0] = (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                    )trim((string_view *)&local_2b8);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_358,(basic_string_view<char,_std::char_traits<char>_> *)local_2d8,
               (allocator<char> *)&local_298);
    parse_value(local_188,&heap,&local_358);
    std::vector<mjs::test_spec,_std::allocator<mjs::test_spec>_>::emplace_back<mjs::test_spec>
              (&specs,(test_spec *)&oss);
    test_spec::~test_spec((test_spec *)&oss);
    std::__cxx11::string::~string((string *)&local_358);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&extend.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    __pos_01 = sVar2 + 1;
  }
  if (specs.super__Vector_base<mjs::test_spec,_std::allocator<mjs::test_spec>_>._M_impl.
      super__Vector_impl_data._M_start ==
      specs.super__Vector_base<mjs::test_spec,_std::allocator<mjs::test_spec>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&extend,name,(allocator<char> *)local_2d8);
    std::operator+(&local_358,"Invalid test spec.",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&extend);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                   &local_358,": No specs found");
    std::runtime_error::runtime_error(prVar3,(string *)&oss);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  parse((mjs *)&local_318,&file,non_strict);
  __val = test_spec_runner::run(&heap,&specs,local_318);
  if (__val == ((long)specs.super__Vector_base<mjs::test_spec,_std::allocator<mjs::test_spec>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)specs.super__Vector_base<mjs::test_spec,_std::allocator<mjs::test_spec>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x48) {
    if (local_318 != (block_statement *)0x0) {
      (*(local_318->super_statement).super_syntax_node._vptr_syntax_node[1])();
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::vector<mjs::test_spec,_std::allocator<mjs::test_spec>_>::~vector(&specs);
    gc_heap::garbage_collect(&heap);
    if ((int)(((ulong)(heap.alloc_context_.next_free_ - heap.alloc_context_.start_) * 100) /
             (ulong)(heap.alloc_context_.capacity_ - heap.alloc_context_.start_)) == 0) {
      gc_heap::~gc_heap(&heap);
      return;
    }
    std::__cxx11::wostringstream::wostringstream((wostringstream *)&oss);
    pwVar4 = std::operator<<((wostream *)&oss,"Leaks in test spec: ");
    pwVar4 = (wostream *)
             std::wostream::operator<<
                       ((wostream *)pwVar4,
                        (int)(((ulong)(heap.alloc_context_.next_free_ - heap.alloc_context_.start_)
                              * 100) / (ulong)(heap.alloc_context_.capacity_ -
                                              heap.alloc_context_.start_)));
    pwVar4 = std::operator<<(pwVar4,"%\n");
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    std::__cxx11::wstring::_M_construct<char_const*>
              ((wstring *)&local_358,source_text->_M_str,source_text->_M_str + source_text->_M_len);
    std::operator<<(pwVar4,(wstring *)&local_358);
    std::__cxx11::wstring::~wstring((wstring *)&local_358);
    std::__cxx11::wstringbuf::str();
    extend.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_358._M_string_length;
    extend.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358._M_dataplus._M_p;
    throw_runtime_error((wstring_view *)&extend,
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_spec.cpp"
                        ,0x10a);
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_1c8,name,&local_359);
  std::operator+(&local_298,"Invalid test spec.",&local_1c8);
  std::operator+(&local_2b8,&local_298,": Only ");
  std::__cxx11::to_string(&local_1e8,__val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                 &local_2b8,&local_1e8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&extend,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                 " of ");
  std::__cxx11::to_string
            (&local_208,
             ((long)specs.super__Vector_base<mjs::test_spec,_std::allocator<mjs::test_spec>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)specs.super__Vector_base<mjs::test_spec,_std::allocator<mjs::test_spec>_>._M_impl
                   .super__Vector_impl_data._M_start) / 0x48);
  std::operator+(&local_358,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&extend,
                 &local_208);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                 &local_358," specs ran");
  std::runtime_error::runtime_error(prVar3,(string *)&oss);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void run_test_spec(const std::string_view& source_text, const std::string_view& name) {
    constexpr const char delim[] = "//$";
    constexpr const int delim_len = sizeof(delim)-1;


    gc_heap heap{1<<20};

    {
        std::vector<test_spec> specs;
        auto file = std::make_shared<source_file>(std::wstring(name.begin(), name.end()), std::wstring(source_text.begin(), source_text.end()), tested_version());

        for (size_t pos = 0, next_pos; pos < source_text.length(); pos = next_pos + 1) {
            size_t delim_pos = source_text.find(delim, pos);
            if (delim_pos == std::string_view::npos) {
                break;
            }
            next_pos = source_text.find("\n", delim_pos);
            if (next_pos == std::string_view::npos) {
                throw std::runtime_error("Invalid test spec." + std::string(name) + ": line terminator missing.");
            }

            delim_pos += delim_len;

            source_extend extend{file, static_cast<uint32_t>(pos), static_cast<uint32_t>(next_pos)};

            specs.push_back(test_spec{extend, static_cast<uint32_t>(delim_pos), parse_value(heap, std::string(trim(source_text.substr(delim_pos, next_pos - delim_pos))))});
        }

        if (specs.empty()) {
            throw std::runtime_error("Invalid test spec." + std::string(name) + ": No specs found");
        }

        auto bs = parse(file);
        const auto index = test_spec_runner::run(heap, specs, *bs);
        if (index != specs.size()) {
            throw std::runtime_error("Invalid test spec." + std::string(name) + ": Only " + std::to_string(index) + " of " + std::to_string(specs.size()) + " specs ran");
        }
    }

    heap.garbage_collect();
    if (heap.use_percentage()) {
        std::wostringstream oss;
        oss << "Leaks in test spec: " << heap.use_percentage() << "%\n" << std::wstring(source_text.begin(), source_text.end());
        THROW_RUNTIME_ERROR(oss.str());
    }

}